

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

bitwidth_t __thiscall slang::SVInt::countXs(SVInt *this)

{
  uint64_t *puVar1;
  bitwidth_t bVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  bVar2 = 0;
  if (((this->super_SVIntStorage).unknownFlag == true) &&
     (uVar3 = (this->super_SVIntStorage).bitWidth + 0x3f, bVar2 = 0, 0x3f < uVar3)) {
    uVar4 = (ulong)(uVar3 >> 6);
    puVar1 = (this->super_SVIntStorage).field_0.pVal;
    uVar6 = 0;
    bVar2 = 0;
    do {
      uVar5 = ~puVar1[uVar6] & puVar1[uVar4 + uVar6];
      uVar5 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
      uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
      bVar2 = bVar2 + (byte)(((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38)
      ;
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  return bVar2;
}

Assistant:

bitwidth_t SVInt::countXs() const {
    if (!unknownFlag)
        return 0;

    bitwidth_t count = 0;
    uint32_t words = getNumWords(bitWidth, false);
    for (uint32_t i = 0; i < words; i++)
        count += (bitwidth_t)std::popcount(~pVal[i] & pVal[i + words]);

    return count;
}